

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O0

bool helics::fileops::callIfMember
               (value *element,string *key,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *call)

{
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  string empty;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  _Alloc_hider in_stack_ffffffffffffffc0;
  basic_value<toml::type_config> *in_stack_ffffffffffffffc8;
  bool local_1;
  
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffc0;
  std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  this = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                   (in_stack_ffffffffffffffc8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffc0._M_p,in_stack_ffffffffffffffb8);
  local_1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38c00f);
  if (!local_1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)this,__args);
  }
  local_1 = !local_1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return local_1;
}

Assistant:

inline bool callIfMember(const toml::value& element,
                         const std::string& key,
                         const std::function<void(const std::string&)>& call)
{
    const std::string empty;
    auto& val = toml::find_or<std::string>(element, key, empty);
    if (!val.empty()) {
        call(val);
        return true;
    }
    return false;
}